

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

String * __thiscall
Json::Value::Comments::get_abi_cxx11_
          (String *__return_storage_ptr__,Comments *this,CommentPlacement slot)

{
  bool bVar1;
  type this_00;
  reference pvVar2;
  CommentPlacement slot_local;
  Comments *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    this_00 = std::
              unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ::operator*(&this->ptr_);
    pvVar2 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             ::operator[](this_00,(ulong)slot);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String Value::Comments::get(CommentPlacement slot) const {
  if (!ptr_)
    return {};
  return (*ptr_)[slot];
}